

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_srtp.cc
# Opt level: O0

int ssl_ctx_make_profiles
              (char *profiles_string,UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> *out)

{
  SRTP_PROTECTION_PROFILE *pSVar1;
  bool bVar2;
  int iVar3;
  stack_st_SRTP_PROTECTION_PROFILE *__p;
  pointer sk;
  size_t sVar4;
  size_t local_60;
  SRTP_PROTECTION_PROFILE *local_50;
  SRTP_PROTECTION_PROFILE *profile;
  char *ptr;
  char *col;
  unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> local_28;
  UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> profiles;
  UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> *out_local;
  char *profiles_string_local;
  
  profiles._M_t.super___uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>.
  _M_t.super__Tuple_impl<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter,_true,_true>)out;
  __p = sk_SRTP_PROTECTION_PROFILE_new_null();
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,bssl::internal::Deleter> *)&local_28,__p);
  bVar2 = std::operator==(&local_28,(nullptr_t)0x0);
  pSVar1 = (SRTP_PROTECTION_PROFILE *)profiles_string;
  if (bVar2) {
    ERR_put_error(0x10,0,0xd3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                  ,0x3d);
    profiles_string_local._4_4_ = 0;
  }
  else {
    while( true ) {
      profile = pSVar1;
      ptr = strchr((char *)profile,0x3a);
      pSVar1 = profile;
      if (ptr == (char *)0x0) {
        local_60 = strlen((char *)profile);
      }
      else {
        local_60 = (long)ptr - (long)profile;
      }
      iVar3 = find_profile_by_name((char *)pSVar1,&local_50,local_60);
      if (iVar3 == 0) {
        ERR_put_error(0x10,0,0xd4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                      ,0x49);
        profiles_string_local._4_4_ = 0;
        goto LAB_0015aca6;
      }
      sk = std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::get
                     (&local_28);
      sVar4 = sk_SRTP_PROTECTION_PROFILE_push(sk,local_50);
      if (sVar4 == 0) {
        profiles_string_local._4_4_ = 0;
        goto LAB_0015aca6;
      }
      if (ptr == (char *)0x0) break;
      pSVar1 = (SRTP_PROTECTION_PROFILE *)(ptr + 1);
    }
    std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::operator=
              ((unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *)
               profiles._M_t.
               super___uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>._M_t
               .super__Tuple_impl<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_false>._M_head_impl,
               &local_28);
    profiles_string_local._4_4_ = 1;
  }
LAB_0015aca6:
  col._0_4_ = 1;
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::~unique_ptr(&local_28)
  ;
  return profiles_string_local._4_4_;
}

Assistant:

static int ssl_ctx_make_profiles(
    const char *profiles_string,
    UniquePtr<STACK_OF(SRTP_PROTECTION_PROFILE)> *out) {
  UniquePtr<STACK_OF(SRTP_PROTECTION_PROFILE)> profiles(
      sk_SRTP_PROTECTION_PROFILE_new_null());
  if (profiles == nullptr) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SRTP_COULD_NOT_ALLOCATE_PROFILES);
    return 0;
  }

  const char *col;
  const char *ptr = profiles_string;
  do {
    col = strchr(ptr, ':');

    const SRTP_PROTECTION_PROFILE *profile;
    if (!find_profile_by_name(ptr, &profile,
                              col ? (size_t)(col - ptr) : strlen(ptr))) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SRTP_UNKNOWN_PROTECTION_PROFILE);
      return 0;
    }

    if (!sk_SRTP_PROTECTION_PROFILE_push(profiles.get(), profile)) {
      return 0;
    }

    if (col) {
      ptr = col + 1;
    }
  } while (col);

  *out = std::move(profiles);
  return 1;
}